

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall
rapidjson::internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
Expand<unsigned_long>
          (Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this,size_t count)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  size_t sVar1;
  ulong uVar2;
  size_t newSize;
  ulong local_20;
  size_t newCapacity;
  size_t count_local;
  Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this_local;
  
  if (this->stack_ == (char *)0x0) {
    if (this->allocator_ == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
      this_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x18);
      MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
                (this_00,0x10000,(CrtAllocator *)0x0);
      this->allocator_ = this_00;
      this->ownAllocator_ = this_00;
    }
    local_20 = this->initialCapacity_;
  }
  else {
    local_20 = GetCapacity(this);
    local_20 = (local_20 + 1 >> 1) + local_20;
  }
  sVar1 = GetSize(this);
  uVar2 = sVar1 + count * 8;
  if (local_20 < uVar2) {
    local_20 = uVar2;
  }
  Resize(this,local_20);
  return;
}

Assistant:

void Expand(size_t count) {
        // Only expand the capacity if the current stack exists. Otherwise just create a stack with initial capacity.
        size_t newCapacity;
        if (stack_ == 0) {
            if (!allocator_)
                ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();
            newCapacity = initialCapacity_;
        } else {
            newCapacity = GetCapacity();
            newCapacity += (newCapacity + 1) / 2;
        }
        size_t newSize = GetSize() + sizeof(T) * count;
        if (newCapacity < newSize)
            newCapacity = newSize;

        Resize(newCapacity);
    }